

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  FILE *__stream;
  size_t sVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  wasm_name_t *name;
  wasm_externtype_t *pwVar9;
  undefined8 uVar10;
  char *__s;
  ulong uVar11;
  wasm_extern_vec_t exports;
  wasm_exporttype_vec_t export_types;
  wasm_byte_vec_t binary;
  wasm_extern_vec_t imports;
  
  puts("Initializing...");
  uVar3 = wasm_engine_new();
  uVar4 = wasm_store_new(uVar3);
  puts("Loading binary...");
  __stream = fopen("reflect.wasm","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar5 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&binary,sVar5);
    sVar5 = fread(binary.data,sVar5,1,__stream);
    if (sVar5 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar6 = wasm_module_new(uVar4,&binary);
      if (lVar6 == 0) {
        __s = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(&binary);
        puts("Instantiating module...");
        imports.size = 0;
        imports.data = (wasm_extern_t **)0x0;
        lVar7 = wasm_instance_new(uVar4,lVar6,&imports,0);
        if (lVar7 != 0) {
          puts("Extracting export...");
          wasm_module_exports(lVar6,&export_types);
          wasm_instance_exports(lVar7,&exports);
          if (exports.size != export_types.size) {
            __assert_fail("exports.size == export_types.size",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/reflect.c"
                          ,0x87,"int main(int, const char **)");
          }
          uVar11 = 0;
          while( true ) {
            if (exports.size <= uVar11) {
              wasm_module_delete(lVar6);
              wasm_instance_delete(lVar7);
              wasm_extern_vec_delete(&exports);
              wasm_exporttype_vec_delete(&export_types);
              puts("Shutting down...");
              wasm_store_delete(uVar4);
              wasm_engine_delete(uVar3);
              puts("Done.");
              return 0;
            }
            cVar1 = wasm_extern_kind(exports.data[uVar11]);
            uVar8 = wasm_exporttype_type(export_types.data[uVar11]);
            cVar2 = wasm_externtype_kind(uVar8);
            if (cVar1 != cVar2) break;
            printf("> export %zu ",uVar11);
            name = (wasm_name_t *)wasm_exporttype_name(export_types.data[uVar11]);
            print_name(name);
            putchar(10);
            printf(">> initial: ");
            pwVar9 = (wasm_externtype_t *)wasm_exporttype_type(export_types.data[uVar11]);
            print_externtype(pwVar9);
            putchar(10);
            printf(">> current: ");
            pwVar9 = (wasm_externtype_t *)wasm_extern_type(exports.data[uVar11]);
            print_externtype(pwVar9);
            wasm_externtype_delete(pwVar9);
            putchar(10);
            cVar1 = wasm_extern_kind(exports.data[uVar11]);
            if (cVar1 == '\0') {
              uVar8 = wasm_extern_as_func(exports.data[uVar11]);
              uVar10 = wasm_func_param_arity(uVar8);
              printf(">> in-arity: %zu",uVar10);
              uVar8 = wasm_func_result_arity(uVar8);
              printf(", out-arity: %zu\n",uVar8);
            }
            uVar11 = uVar11 + 1;
          }
          __assert_fail("wasm_extern_kind(exports.data[i]) == wasm_externtype_kind(wasm_exporttype_type(export_types.data[i]))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/reflect.c"
                        ,0x8b,"int main(int, const char **)");
        }
        __s = "> Error instantiating module!";
      }
      goto LAB_0010289b;
    }
  }
  __s = "> Error loading module!";
LAB_0010289b:
  puts(__s);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("reflect.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_vec_t imports = WASM_EMPTY_VEC;
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  // Extract export.
  printf("Extracting export...\n");
  own wasm_exporttype_vec_t export_types;
  own wasm_extern_vec_t exports;
  wasm_module_exports(module, &export_types);
  wasm_instance_exports(instance, &exports);
  assert(exports.size == export_types.size);

  for (size_t i = 0; i < exports.size; ++i) {
    assert(wasm_extern_kind(exports.data[i]) ==
      wasm_externtype_kind(wasm_exporttype_type(export_types.data[i])));
    printf("> export %zu ", i);
    print_name(wasm_exporttype_name(export_types.data[i]));
    printf("\n");
    printf(">> initial: ");
    print_externtype(wasm_exporttype_type(export_types.data[i]));
    printf("\n");
    printf(">> current: ");
    own wasm_externtype_t* current = wasm_extern_type(exports.data[i]);
    print_externtype(current);
    wasm_externtype_delete(current);
    printf("\n");
    if (wasm_extern_kind(exports.data[i]) == WASM_EXTERN_FUNC) {
      wasm_func_t* func = wasm_extern_as_func(exports.data[i]);
      printf(">> in-arity: %zu", wasm_func_param_arity(func));
      printf(", out-arity: %zu\n", wasm_func_result_arity(func));
    }
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);
  wasm_extern_vec_delete(&exports);
  wasm_exporttype_vec_delete(&export_types);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}